

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

void y4m_422jpeg_420jpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uint uVar9;
  uchar uVar10;
  int iVar11;
  uchar *puVar12;
  long lVar13;
  uchar *puVar14;
  uchar *puVar15;
  uint uVar16;
  ulong uVar17;
  uchar *puVar18;
  uint uVar19;
  uchar *puVar20;
  uchar *puVar21;
  byte *local_88;
  
  if (0 < _c_w) {
    uVar3 = _c_h - 1;
    uVar6 = 1;
    if ((int)uVar3 < 1) {
      uVar6 = uVar3;
    }
    uVar7 = 2;
    if ((int)uVar3 < 2) {
      uVar7 = uVar3;
    }
    uVar9 = 3;
    if ((int)uVar3 < 3) {
      uVar9 = uVar3;
    }
    uVar4 = (ulong)(uint)_c_w;
    lVar2 = uVar4 * 2;
    lVar13 = 0;
    puVar5 = _dst;
    local_88 = _src;
    do {
      uVar16 = 0;
      if (0 < _c_h) {
        iVar11 = (int)((uint)local_88[(int)(uVar9 * _c_w)] + (uint)local_88[(int)(uVar9 * _c_w)] * 2
                       + (uint)local_88[(int)(uVar6 * _c_w)] * 0x4e + (uint)*local_88 * 0x40 +
                         (uint)local_88[(int)(uVar7 * _c_w)] * -0x11 + 0x40) >> 7;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        uVar10 = (uchar)iVar11;
        if (iVar11 < 1) {
          uVar10 = '\0';
        }
        *puVar5 = uVar10;
        uVar16 = 2;
      }
      if ((int)uVar16 < _c_h + -3) {
        uVar17 = (ulong)uVar16;
        puVar15 = _src + (uVar17 + 1) * uVar4;
        puVar20 = _src + uVar4 * uVar17;
        puVar12 = _src + (uVar17 + 3) * uVar4;
        puVar8 = _src + (uVar17 - 2) * uVar4;
        puVar21 = _src + (uVar17 - 1) * uVar4;
        puVar14 = _dst + (uVar16 >> 1) * uVar4;
        puVar18 = _src + (uVar17 + 2) * uVar4;
        do {
          iVar11 = (int)(((uint)puVar12[lVar13] + (uint)puVar8[lVar13]) * 3 +
                         ((uint)puVar18[lVar13] + (uint)puVar21[lVar13]) * -0x11 +
                         ((uint)puVar15[lVar13] + (uint)puVar20[lVar13]) * 0x4e + 0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          uVar17 = uVar17 + 2;
          puVar14[lVar13] = (uchar)iVar11;
          puVar15 = puVar15 + lVar2;
          puVar20 = puVar20 + lVar2;
          puVar12 = puVar12 + lVar2;
          puVar8 = puVar8 + lVar2;
          puVar21 = puVar21 + lVar2;
          puVar14 = puVar14 + uVar4;
          puVar18 = puVar18 + lVar2;
        } while ((long)uVar17 < (long)(_c_h + -3));
        uVar16 = (uint)uVar17;
      }
      if ((int)uVar16 < _c_h) {
        uVar17 = (ulong)uVar16;
        puVar8 = _src + uVar4 * uVar17;
        puVar14 = _src + (uVar17 - 2) * uVar4;
        puVar15 = _src + (uVar17 - 1) * uVar4;
        puVar12 = _dst + (uVar16 >> 1) * uVar4;
        do {
          uVar1 = uVar17 + 2;
          uVar16 = uVar3;
          if ((int)(uint)uVar1 < (int)uVar3) {
            uVar16 = (uint)uVar1;
          }
          uVar19 = (uint)uVar17 | 1;
          if ((int)uVar3 <= (int)uVar19) {
            uVar19 = uVar3;
          }
          iVar11 = (int)(((uint)local_88[(int)(uVar3 * _c_w)] + (uint)puVar14[lVar13]) * 3 +
                         ((uint)local_88[(int)(uVar16 * _c_w)] + (uint)puVar15[lVar13]) * -0x11 +
                         ((uint)local_88[(int)(uVar19 * _c_w)] + (uint)puVar8[lVar13]) * 0x4e + 0x40
                        ) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          puVar12[lVar13] = (uchar)iVar11;
          puVar8 = puVar8 + lVar2;
          puVar14 = puVar14 + lVar2;
          puVar15 = puVar15 + lVar2;
          puVar12 = puVar12 + uVar4;
          uVar17 = uVar1;
        } while ((long)uVar1 < (long)_c_h);
      }
      local_88 = local_88 + 1;
      puVar5 = puVar5 + 1;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != _c_w);
  }
  return;
}

Assistant:

static void y4m_422jpeg_420jpeg_helper(unsigned char *_dst,
                                       const unsigned char *_src, int _c_w,
                                       int _c_h) {
  int y;
  int x;
  /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
  for (x = 0; x < _c_w; x++) {
    for (y = 0; y < OC_MINI(_c_h, 2); y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (64 * _src[0] + 78 * _src[OC_MINI(1, _c_h - 1) * _c_w] -
                     17 * _src[OC_MINI(2, _c_h - 1) * _c_w] +
                     3 * _src[OC_MINI(3, _c_h - 1) * _c_w] + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h - 3; y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (3 * (_src[(y - 2) * _c_w] + _src[(y + 3) * _c_w]) -
                     17 * (_src[(y - 1) * _c_w] + _src[(y + 2) * _c_w]) +
                     78 * (_src[y * _c_w] + _src[(y + 1) * _c_w]) + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h; y += 2) {
      _dst[(y >> 1) * _c_w] = OC_CLAMPI(
          0,
          (3 * (_src[(y - 2) * _c_w] + _src[(_c_h - 1) * _c_w]) -
           17 * (_src[(y - 1) * _c_w] + _src[OC_MINI(y + 2, _c_h - 1) * _c_w]) +
           78 * (_src[y * _c_w] + _src[OC_MINI(y + 1, _c_h - 1) * _c_w]) +
           64) >>
              7,
          255);
    }
    _src++;
    _dst++;
  }
}